

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O0

int bios_u8(envy_bios *bios,uint offs,uint8_t *res)

{
  undefined1 *in_RDX;
  uint in_ESI;
  long *in_RDI;
  int local_4;
  
  if (in_ESI < *(uint *)(in_RDI + 1)) {
    *in_RDX = *(undefined1 *)(*in_RDI + (ulong)in_ESI);
    local_4 = 0;
  }
  else {
    *in_RDX = 0;
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)in_ESI);
    local_4 = -0xe;
  }
  return local_4;
}

Assistant:

static inline int bios_u8(struct envy_bios *bios, unsigned int offs, uint8_t *res) {
	if (offs >= bios->length) {
		*res = 0;
		ENVY_BIOS_ERR("requested OOB u8 at 0x%04x\n", offs);
		return -EFAULT;
	}
	*res = bios->data[offs];
	return 0;
}